

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O0

void __thiscall ncnn::Gemm::Gemm(Gemm *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffff40;
  
  Layer::Layer(in_stack_ffffffffffffff40);
  *in_RDI = &PTR__Gemm_0202ab90;
  in_RDI[0x24] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  *(undefined4 *)(in_RDI + 0x27) = 0;
  in_RDI[0x28] = 0;
  *(undefined4 *)(in_RDI + 0x29) = 0;
  *(undefined4 *)((long)in_RDI + 0x14c) = 0;
  *(undefined4 *)(in_RDI + 0x2a) = 0;
  *(undefined4 *)((long)in_RDI + 0x154) = 0;
  *(undefined4 *)(in_RDI + 0x2b) = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  in_RDI[0x31] = 0;
  *(undefined4 *)(in_RDI + 0x32) = 0;
  *(undefined4 *)((long)in_RDI + 0x194) = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  *(undefined4 *)((long)in_RDI + 0x19c) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  in_RDI[0x37] = 0;
  in_RDI[0x38] = 0;
  *(undefined4 *)(in_RDI + 0x39) = 0;
  in_RDI[0x3a] = 0;
  *(undefined4 *)(in_RDI + 0x3b) = 0;
  *(undefined4 *)((long)in_RDI + 0x1dc) = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  *(undefined4 *)((long)in_RDI + 0x1e4) = 0;
  *(undefined4 *)(in_RDI + 0x3d) = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x3f] = 0;
  in_RDI[0x40] = 0;
  in_RDI[0x41] = 0;
  *(undefined4 *)(in_RDI + 0x42) = 0;
  in_RDI[0x43] = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)((long)in_RDI + 0x224) = 0;
  *(undefined4 *)(in_RDI + 0x45) = 0;
  *(undefined4 *)((long)in_RDI + 0x22c) = 0;
  *(undefined4 *)(in_RDI + 0x46) = 0;
  in_RDI[0x47] = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Gemm::Gemm()
{
    one_blob_only = false;
    support_inplace = false;
}